

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O2

void __thiscall Diligent::QueryManagerVk::~QueryManagerVk(QueryManagerVk *this)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  QUERY_TYPE QueryType;
  long lVar4;
  Diligent local_1f8 [32];
  string _msg;
  stringstream QueryUsageSS;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&QueryUsageSS);
  std::operator<<(local_1a8,"Vulkan query manager peak usage:");
  QueryType = QUERY_TYPE_OCCLUSION;
  for (lVar4 = 0xa8; lVar4 != 0x328; lVar4 = lVar4 + 0x80) {
    if (*(long *)((long)(this->m_Pools)._M_elems + lVar4 + -0x18) != 0) {
      poVar2 = std::endl<char,std::char_traits<char>>(local_1a8);
      lVar1 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 0x1e;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x20;
      pcVar3 = GetQueryTypeString(QueryType);
      poVar2 = std::operator<<(poVar2,pcVar3);
      poVar2 = std::operator<<(poVar2,": ");
      lVar1 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar1 + -0x18) + 0x10) = 4;
      lVar1 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar2 + lVar1 + 0x18) = *(uint *)(poVar2 + lVar1 + 0x18) & 0xffffff4f | 0x80;
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      poVar2 = std::operator<<(poVar2,'/');
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 4;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    QueryType = QueryType + QUERY_TYPE_OCCLUSION;
  }
  std::__cxx11::stringbuf::str();
  FormatString<std::__cxx11::string>(&_msg,local_1f8,Args);
  std::__cxx11::string::~string((string *)local_1f8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,_msg._M_dataplus._M_p,0,0,0);
  }
  std::__cxx11::string::~string((string *)&_msg);
  std::__cxx11::stringstream::~stringstream((stringstream *)&QueryUsageSS);
  std::array<Diligent::QueryManagerVk::QueryPoolInfo,_6UL>::~array(&this->m_Pools);
  return;
}

Assistant:

QueryManagerVk::~QueryManagerVk()
{
    std::stringstream QueryUsageSS;
    QueryUsageSS << "Vulkan query manager peak usage:";
    for (Uint32 QueryType = QUERY_TYPE_UNDEFINED + 1; QueryType < QUERY_TYPE_NUM_TYPES; ++QueryType)
    {
        auto& PoolInfo = m_Pools[QueryType];
        if (PoolInfo.IsNull())
            continue;

        QueryUsageSS << std::endl
                     << std::setw(30) << std::left << GetQueryTypeString(static_cast<QUERY_TYPE>(QueryType)) << ": "
                     << std::setw(4) << std::right << PoolInfo.GetMaxAllocatedQueries()
                     << '/' << std::setw(4) << PoolInfo.GetQueryCount();
    }
    LOG_INFO_MESSAGE(QueryUsageSS.str());
}